

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O3

void __thiscall sf::RenderTarget::applyCurrentView(RenderTarget *this)

{
  PFNGLLOADMATRIXFPROC p_Var1;
  int extraout_var;
  Transform *this_00;
  float *pfVar2;
  IntRect IVar3;
  
  IVar3 = getViewport(this,&this->m_view);
  (*this->_vptr_RenderTarget[2])(this);
  (*sf_glad_glViewport)
            (IVar3.left,extraout_var - (IVar3.top + IVar3.height),IVar3.width,IVar3.height);
  (*sf_glad_glMatrixMode)(0x1701);
  p_Var1 = sf_glad_glLoadMatrixf;
  this_00 = View::getTransform(&this->m_view);
  pfVar2 = Transform::getMatrix(this_00);
  (*p_Var1)(pfVar2);
  (*sf_glad_glMatrixMode)(0x1700);
  (this->m_cache).viewChanged = false;
  return;
}

Assistant:

void RenderTarget::applyCurrentView()
{
    // Set the viewport
    IntRect viewport = getViewport(m_view);
    int top = static_cast<int>(getSize().y) - (viewport.top + viewport.height);
    glCheck(glViewport(viewport.left, top, viewport.width, viewport.height));

    // Set the projection matrix
    glCheck(glMatrixMode(GL_PROJECTION));
    glCheck(glLoadMatrixf(m_view.getTransform().getMatrix()));

    // Go back to model-view mode
    glCheck(glMatrixMode(GL_MODELVIEW));

    m_cache.viewChanged = false;
}